

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

void merge_cache_lcp_2way<true,unsigned_int>
               (uchar **from0,lcp_t *lcp_input0,uint *cache_input0,size_t n0,uchar **from1,
               lcp_t *lcp_input1,uint *cache_input1,size_t n1,uchar **result,lcp_t *lcp_result,
               uint *cache_result)

{
  uchar *puVar1;
  uchar *puVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  uchar **__dest;
  uint *puVar9;
  lcp_t lVar10;
  uint local_d0;
  uint local_cc;
  ulong local_c8;
  size_t local_c0;
  lcp_t *local_b8;
  uchar **local_b0;
  uint *local_a8;
  lcp_t *local_a0;
  uint *local_98;
  uchar **local_88;
  size_t local_80;
  string local_70;
  string local_50;
  
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"merge_cache_lcp_2way",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(): n0=",7);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", n1=",5);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  local_70._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_70,1);
  check_input<unsigned_int>(from0,lcp_input0,cache_input0,n0);
  local_80 = n1;
  check_input<unsigned_int>(from1,lcp_input1,cache_input1,n1);
  local_a8 = cache_input0 + 1;
  local_cc = *cache_input0;
  local_98 = cache_input1 + 1;
  local_d0 = *cache_input1;
  local_a0 = lcp_input1;
  local_88 = from1;
  if (local_cc < local_d0) {
    puVar1 = *from0;
    if (puVar1 == (uchar *)0x0) {
LAB_0024bc5c:
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
    }
    puVar2 = *from1;
    if (puVar2 == (uchar *)0x0) {
LAB_0024bc7b:
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar3 = strcmp((char *)puVar1,(char *)puVar2);
    if (-1 < iVar3) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                   );
    }
    if ((local_cc & 0xff000000) == (local_d0 & 0xff000000) && (local_cc & 0xff000000) != 0) {
      uVar4 = 1;
      if ((local_cc & 0xff0000) == (local_d0 & 0xff0000) && (local_cc & 0xff0000) != 0) {
        uVar4 = ((local_cc & 0xff00) == (local_d0 & 0xff00) && (local_cc & 0xff00) != 0) | 2;
      }
      if (puVar2[uVar4] == 0) {
        local_d0 = 0;
      }
      else {
        local_d0 = (uint)puVar2[uVar4] << 0x18;
        if (puVar2[(ulong)uVar4 + 1] != 0) {
          local_d0 = local_d0 | (uint)puVar2[(ulong)uVar4 + 1] << 0x10;
          if (puVar2[(ulong)uVar4 + 2] != '\0') {
            local_d0 = local_d0 | CONCAT11(puVar2[(ulong)uVar4 + 2],puVar2[(ulong)uVar4 + 3]);
          }
        }
      }
    }
    else {
      uVar4 = 0;
    }
    *result = puVar1;
    *cache_result = local_cc;
    uVar8 = (ulong)uVar4;
LAB_0024ae92:
    puVar9 = cache_result + 1;
    __dest = result + 1;
    if (n0 == 1) {
LAB_0024aee0:
      if (local_80 == 0) {
        __assert_fail("n1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x51e,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                     );
      }
      *lcp_result = uVar8;
      *puVar9 = local_d0;
      memmove(__dest,local_88,local_80 * 8);
      memmove(lcp_result + 1,local_a0,local_80 * 8);
      goto LAB_0024bae7;
    }
    local_c8 = *lcp_input0;
    local_cc = cache_input0[1];
LAB_0024aecd:
    local_b0 = from0 + 1;
    local_b8 = lcp_input0 + 1;
    local_c0 = n0 - 1;
    local_a8 = cache_input0 + 2;
LAB_0024aff4:
    puVar9 = cache_result + 1;
    __dest = result + 1;
    do {
      while( true ) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Starting loop, n0=",0x12);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", n1=",5);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ...\n",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tprev   = \'",0xb);
        puVar1 = __dest[-1];
        iVar3 = (int)poVar5;
        if (puVar1 == (uchar *)0x0) {
          std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar6 = strlen((char *)puVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)puVar1,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t*from0 = \'",0xb);
        puVar1 = *local_b0;
        if (puVar1 == (uchar *)0x0) {
          std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar6 = strlen((char *)puVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)puVar1,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t*from1 = \'",0xb);
        puVar1 = *local_88;
        if (puVar1 == (uchar *)0x0) {
          std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar6 = strlen((char *)puVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)puVar1,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tlcp0   = ",10);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tlcp1   = ",10);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tcache0 = \'",0xb);
        to_str_abi_cxx11_(&local_70,local_cc);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,
                                                    local_70._M_dataplus._M_p._0_1_),
                            CONCAT44(local_70._M_string_length._4_4_,(int)local_70._M_string_length)
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tcache1 = \'",0xb);
        to_str_abi_cxx11_(&local_50,local_d0);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
            &local_70.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_))
          ;
        }
        check_lcp_and_cache<unsigned_int>
                  (__dest[-1],*local_b0,local_c8,local_cc,*local_88,uVar8,local_d0);
        if (uVar8 < local_c8) {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tlcp0 > lcp1\n",0xd);
          puVar1 = *local_b0;
          if (puVar1 != (uchar *)0x0) {
            if (*local_88 != (uchar *)0x0) {
              iVar3 = strcmp((char *)puVar1,(char *)*local_88);
              if (-1 < iVar3) {
                __assert_fail("cmp(*from0, *from1) < 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                              ,0x4ae,
                              "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                             );
              }
              *__dest = puVar1;
              *lcp_result = local_c8;
              *puVar9 = local_cc;
              local_c8 = *local_b8;
              local_cc = *local_a8;
              goto LAB_0024b8fb;
            }
            goto LAB_0024bc7b;
          }
          goto LAB_0024bc5c;
        }
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        if (local_c8 < uVar8) break;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tlcp0 == lcp1\n",0xe);
        if (local_cc < local_d0) {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t\tcache0 < cache1\n",0x12);
          puVar1 = *local_b0;
          if (puVar1 == (uchar *)0x0) goto LAB_0024bc5c;
          puVar2 = *local_88;
          if (puVar2 == (uchar *)0x0) goto LAB_0024bc7b;
          iVar3 = strcmp((char *)puVar1,(char *)puVar2);
          if (-1 < iVar3) {
            __assert_fail("cmp(*from0, *from1) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4c6,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                         );
          }
          if (((local_cc & 0xff000000) != 0) && ((local_cc & 0xff000000) == (local_d0 & 0xff000000))
             ) {
            uVar7 = 1;
            if (((local_cc & 0xff0000) != 0) && ((local_cc & 0xff0000) == (local_d0 & 0xff0000))) {
              uVar7 = (ulong)((local_cc & 0xff00) == (local_d0 & 0xff00) && (local_cc & 0xff00) != 0
                             ) | 2;
            }
            uVar8 = uVar7 + uVar8;
            if (puVar2[uVar8] == 0) {
              local_d0 = 0;
            }
            else {
              local_d0 = (uint)puVar2[uVar8] << 0x18;
              if (puVar2[uVar8 + 1] != 0) {
                local_d0 = local_d0 | (uint)puVar2[uVar8 + 1] << 0x10;
                if (puVar2[uVar8 + 2] != '\0') {
                  local_d0 = local_d0 | CONCAT11(puVar2[uVar8 + 2],puVar2[uVar8 + 3]);
                }
              }
            }
          }
          *__dest = puVar1;
          *lcp_result = local_c8;
          *puVar9 = local_cc;
LAB_0024b8c1:
          local_c8 = *local_b8;
          local_cc = *local_a8;
        }
        else {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          if (local_d0 < local_cc) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t\tcache0 > cache1\n",0x12);
            puVar1 = *local_b0;
            if (puVar1 != (uchar *)0x0) {
              puVar2 = *local_88;
              if (puVar2 != (uchar *)0x0) {
                iVar3 = strcmp((char *)puVar1,(char *)puVar2);
                if (iVar3 < 1) {
                  __assert_fail("cmp(*from0, *from1) > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                                ,0x4d6,
                                "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                               );
                }
                if (((local_cc & 0xff000000) != 0) &&
                   ((local_cc & 0xff000000) == (local_d0 & 0xff000000))) {
                  uVar7 = 1;
                  if (((local_cc & 0xff0000) != 0) &&
                     ((local_cc & 0xff0000) == (local_d0 & 0xff0000))) {
                    uVar7 = (ulong)((local_cc & 0xff00) == (local_d0 & 0xff00) &&
                                   (local_cc & 0xff00) != 0) | 2;
                  }
                  local_c8 = uVar7 + local_c8;
                  if (puVar1[local_c8] == 0) {
                    local_cc = 0;
                  }
                  else {
                    local_cc = (uint)puVar1[local_c8] << 0x18;
                    if (puVar1[local_c8 + 1] != 0) {
                      local_cc = local_cc | (uint)puVar1[local_c8 + 1] << 0x10;
                      if (puVar1[local_c8 + 2] != '\0') {
                        local_cc = local_cc | CONCAT11(puVar1[local_c8 + 2],puVar1[local_c8 + 3]);
                      }
                    }
                  }
                }
                *__dest = puVar2;
                *lcp_result = uVar8;
                *puVar9 = local_d0;
                lVar10 = *local_a0;
                local_d0 = *local_98;
                goto LAB_0024b4b5;
              }
              goto LAB_0024bc7b;
            }
            goto LAB_0024bc5c;
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t\tcache0 == cache1\n",0x13);
          if ((char)local_cc == '\0') {
            puVar1 = *local_b0;
            if (puVar1 == (uchar *)0x0) goto LAB_0024bc5c;
            if (*local_88 == (uchar *)0x0) goto LAB_0024bc7b;
            iVar3 = strcmp((char *)puVar1,(char *)*local_88);
            if (iVar3 != 0) {
              __assert_fail("cmp(*from0, *from1) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4e7,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                           );
            }
            *__dest = puVar1;
            *lcp_result = local_c8;
            *puVar9 = local_cc;
            if (local_cc != 0) goto LAB_0024bd54;
            local_c8 = *local_b8;
            local_cc = *local_a8;
            local_d0 = 0;
          }
          else {
            compare((uchar *)&local_70,*local_b0,(size_t)*local_88);
            uVar8 = CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_);
            if ((int)local_70._M_string_length < 0) {
              *__dest = *local_b0;
              *lcp_result = local_c8;
              *puVar9 = local_cc;
              puVar1 = *local_88;
              if (puVar1 != (uchar *)0x0) {
                if (puVar1[uVar8] == 0) {
                  local_d0 = 0;
                }
                else {
                  local_d0 = (uint)puVar1[uVar8] << 0x18;
                  if (puVar1[uVar8 + 1] != 0) {
                    local_d0 = local_d0 | (uint)puVar1[uVar8 + 1] << 0x10;
                    if (puVar1[uVar8 + 2] != '\0') {
                      local_d0 = local_d0 | CONCAT11(puVar1[uVar8 + 2],puVar1[uVar8 + 3]);
                    }
                  }
                }
                goto LAB_0024b8c1;
              }
              goto LAB_0024bd16;
            }
            if ((int)local_70._M_string_length != 0) {
              *__dest = *local_88;
              *lcp_result = local_c8;
              *puVar9 = local_cc;
              puVar1 = *local_b0;
              if (puVar1 != (uchar *)0x0) {
                if (puVar1[uVar8] == 0) {
                  local_cc = 0;
                }
                else {
                  local_cc = (uint)puVar1[uVar8] << 0x18;
                  if (puVar1[uVar8 + 1] != 0) {
                    local_cc = local_cc | (uint)puVar1[uVar8 + 1] << 0x10;
                    if (puVar1[uVar8 + 2] != '\0') {
                      local_cc = local_cc | CONCAT11(puVar1[uVar8 + 2],puVar1[uVar8 + 3]);
                    }
                  }
                }
                lVar10 = *local_a0;
                local_d0 = *local_98;
                local_c8 = uVar8;
                goto LAB_0024b4b5;
              }
              goto LAB_0024bd16;
            }
            *__dest = *local_b0;
            *lcp_result = local_c8;
            *puVar9 = local_cc;
            local_c8 = *local_b8;
            local_cc = *local_a8;
            local_d0 = 0;
          }
        }
LAB_0024b8fb:
        local_a8 = local_a8 + 1;
        local_b8 = local_b8 + 1;
        puVar9 = puVar9 + 1;
        lcp_result = lcp_result + 1;
        local_b0 = local_b0 + 1;
        __dest = __dest + 1;
        local_c0 = local_c0 - 1;
        if (local_c0 == 0) goto LAB_0024aee0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tlcp0 < lcp1\n",0xd);
      if (*local_b0 == (uchar *)0x0) goto LAB_0024bc5c;
      puVar1 = *local_88;
      if (puVar1 == (uchar *)0x0) goto LAB_0024bc7b;
      iVar3 = strcmp((char *)*local_b0,(char *)puVar1);
      if (iVar3 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x4b7,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                     );
      }
      *__dest = puVar1;
      *lcp_result = uVar8;
      *puVar9 = local_d0;
      lVar10 = *local_a0;
      local_d0 = *local_98;
LAB_0024b4b5:
      local_88 = local_88 + 1;
      local_98 = local_98 + 1;
      local_a0 = local_a0 + 1;
      puVar9 = puVar9 + 1;
      lcp_result = lcp_result + 1;
      __dest = __dest + 1;
      local_80 = local_80 - 1;
      uVar8 = lVar10;
    } while (local_80 != 0);
  }
  else {
    local_c0 = n0;
    local_b8 = lcp_input0;
    local_b0 = from0;
    if (local_cc <= local_d0) {
      if ((char)local_cc == '\0') {
        puVar1 = *from0;
        if (puVar1 == (uchar *)0x0) goto LAB_0024bc5c;
        if (*from1 == (uchar *)0x0) goto LAB_0024bc7b;
        iVar3 = strcmp((char *)puVar1,(char *)*from1);
        if (iVar3 != 0) {
          __assert_fail("cmp(*from0, *from1) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x470,
                        "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                       );
        }
        if (local_cc != 0) {
LAB_0024bd54:
          __assert_fail("a != b or a==0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x3ff,"unsigned int lcp(uint32_t, uint32_t)");
        }
        *result = puVar1;
        __dest = result + 1;
        *cache_result = 0;
        puVar9 = cache_result + 1;
        uVar8 = 0;
        if (n0 == 1) {
          local_d0 = 0;
          goto LAB_0024aee0;
        }
        local_c8 = *lcp_input0;
        local_cc = cache_input0[1];
        local_d0 = 0;
        goto LAB_0024aecd;
      }
      compare((uchar *)&local_70,*from0,(size_t)*from1);
      uVar8 = CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_);
      if ((int)local_70._M_string_length < 0) {
        *result = *from0;
        *cache_result = local_cc;
        puVar1 = *from1;
        if (puVar1 == (uchar *)0x0) {
LAB_0024bd16:
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                        ,0x38,"uint32_t get_char(unsigned char *, size_t)");
        }
        if (puVar1[uVar8] == 0) {
          local_d0 = 0;
        }
        else {
          local_d0 = (uint)puVar1[uVar8] << 0x18;
          if (puVar1[uVar8 + 1] != 0) {
            local_d0 = local_d0 | (uint)puVar1[uVar8 + 1] << 0x10;
            if (puVar1[uVar8 + 2] != '\0') {
              local_d0 = local_d0 | CONCAT11(puVar1[uVar8 + 2],puVar1[uVar8 + 3]);
            }
          }
        }
        goto LAB_0024ae92;
      }
      __dest = result + 1;
      puVar9 = cache_result + 1;
      if ((int)local_70._M_string_length == 0) {
        *result = *from0;
        *cache_result = local_cc;
        local_d0 = 0;
        if (n0 != 1) {
          local_c8 = *lcp_input0;
          local_cc = cache_input0[1];
          goto LAB_0024aecd;
        }
        goto LAB_0024aee0;
      }
      *result = *from1;
      *cache_result = local_d0;
      puVar1 = *from0;
      if (puVar1 == (uchar *)0x0) goto LAB_0024bd16;
      if (puVar1[uVar8] == 0) {
        local_cc = 0;
      }
      else {
        local_cc = (uint)puVar1[uVar8] << 0x18;
        if (puVar1[uVar8 + 1] != 0) {
          local_cc = local_cc | (uint)puVar1[uVar8 + 1] << 0x10;
          if (puVar1[uVar8 + 2] != '\0') {
            local_cc = local_cc | CONCAT11(puVar1[uVar8 + 2],puVar1[uVar8 + 3]);
          }
        }
      }
      local_80 = n1 - 1;
      local_c8 = uVar8;
      if (local_80 == 0) goto LAB_0024ba92;
      local_88 = from1 + 1;
      uVar8 = *lcp_input1;
      local_a0 = lcp_input1 + 1;
      local_d0 = cache_input1[1];
      local_98 = cache_input1 + 2;
      goto LAB_0024aff4;
    }
    puVar1 = *from0;
    if (puVar1 == (uchar *)0x0) goto LAB_0024bc5c;
    puVar2 = *from1;
    if (puVar2 == (uchar *)0x0) goto LAB_0024bc7b;
    iVar3 = strcmp((char *)puVar1,(char *)puVar2);
    if (iVar3 < 1) {
      __assert_fail("cmp(*from0, *from1) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x45c,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                   );
    }
    if ((local_cc & 0xff000000) == (local_d0 & 0xff000000) && (local_cc & 0xff000000) != 0) {
      uVar4 = 1;
      if ((local_cc & 0xff0000) == (local_d0 & 0xff0000) && (local_cc & 0xff0000) != 0) {
        uVar4 = ((local_cc & 0xff00) == (local_d0 & 0xff00) && (local_cc & 0xff00) != 0) | 2;
      }
      if (puVar1[uVar4] == 0) {
        local_cc = 0;
      }
      else {
        local_cc = (uint)puVar1[uVar4] << 0x18;
        if (puVar1[(ulong)uVar4 + 1] != 0) {
          local_cc = local_cc | (uint)puVar1[(ulong)uVar4 + 1] << 0x10;
          if (puVar1[(ulong)uVar4 + 2] != '\0') {
            local_cc = local_cc | CONCAT11(puVar1[(ulong)uVar4 + 2],puVar1[(ulong)uVar4 + 3]);
          }
        }
      }
    }
    else {
      uVar4 = 0;
    }
    *result = puVar2;
    *cache_result = local_d0;
    local_80 = n1 - 1;
    local_c8 = (ulong)uVar4;
    if (local_80 != 0) {
      local_88 = from1 + 1;
      uVar8 = *lcp_input1;
      local_a0 = lcp_input1 + 1;
      local_d0 = cache_input1[1];
      local_98 = cache_input1 + 2;
      goto LAB_0024aff4;
    }
LAB_0024ba92:
    puVar9 = cache_result + 1;
    __dest = result + 1;
  }
  if (local_c0 == 0) {
    __assert_fail("n0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x527,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned int]"
                 );
  }
  *lcp_result = local_c8;
  *puVar9 = local_cc;
  memmove(__dest,local_b0,local_c0 * 8);
  memmove(lcp_result + 1,local_b8,local_c0 * 8);
  local_98 = local_a8;
  local_80 = local_c0;
LAB_0024bae7:
  memmove(puVar9 + 1,local_98,local_80 << 2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  local_70._M_dataplus._M_p._0_1_ = 0x7e;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_70,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"merge_cache_lcp_2way",0x14);
  local_70._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_70,1);
  return;
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}